

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH_errorcode VELOCYPACK_XXH3_64bits_reset_withSeed(XXH3_state_t *statePtr,XXH64_hash_t seed)

{
  long in_RSI;
  long in_RDI;
  XXH3_state_t *in_stack_00000010;
  xxh_u64 in_stack_00000060;
  void *in_stack_00000068;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  XXH_errorcode XVar1;
  
  if (in_RDI == 0) {
    XVar1 = XXH_ERROR;
  }
  else if (in_RSI == 0) {
    XVar1 = VELOCYPACK_XXH3_64bits_reset((XXH3_state_t *)0x0);
  }
  else {
    if (in_RSI != *(long *)(in_RDI + 0x228)) {
      XXH3_initCustomSecret_sse2(in_stack_00000068,in_stack_00000060);
    }
    XXH3_reset_internal(in_stack_00000010,(XXH64_hash_t)statePtr,(void *)seed,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    XVar1 = XXH_OK;
  }
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH3_64bits_reset_withSeed(XXH3_state_t* statePtr,
                                                        XXH64_hash_t seed) {
  if (statePtr == NULL) return XXH_ERROR;
  if (seed == 0) return XXH3_64bits_reset(statePtr);
  if (seed != statePtr->seed)
    XXH3_initCustomSecret(statePtr->customSecret, seed);
  XXH3_reset_internal(statePtr, seed, NULL, XXH_SECRET_DEFAULT_SIZE);
  return XXH_OK;
}